

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::ActualConfigure(cmake *this)

{
  bool bVar1;
  uint uVar2;
  string *psVar3;
  pointer pcVar4;
  string *psVar5;
  ulong uVar6;
  pointer pcVar7;
  pointer this_00;
  vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
  *this_01;
  pointer this_02;
  pointer messenger;
  byte local_a8a;
  allocator<char> local_831;
  string local_830;
  byte local_80b;
  byte local_80a;
  allocator<char> local_809;
  string local_808;
  cmValue local_7e8;
  allocator<char> local_7d9;
  string local_7d8;
  const_reference local_7b8;
  value_type *mf;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  cmValue local_760;
  allocator<char> local_751;
  string local_750;
  allocator<char> local_729;
  string local_728;
  cmValue local_708;
  allocator<char> local_6f9;
  string local_6f8;
  cmValue local_6d8;
  cmake *local_6d0;
  unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_> local_6c8;
  allocator<char> local_6b9;
  string local_6b8;
  cmAlphaNum local_698;
  cmAlphaNum local_668;
  undefined1 local_638 [8];
  string message_3;
  string local_610;
  cmValue local_5f0;
  cmValue tsName;
  string local_5e0;
  cmAlphaNum local_5c0;
  cmAlphaNum local_590;
  undefined1 local_560 [8];
  string message_2;
  string local_538;
  cmValue local_518;
  cmValue platformName;
  string local_508;
  cmAlphaNum local_4e8;
  cmAlphaNum local_4b8;
  undefined1 local_488 [8];
  string message_1;
  string local_460;
  cmValue local_440;
  cmValue instance;
  string local_430;
  undefined1 local_410 [8];
  string envToolchain;
  string local_3e8;
  cmValue local_3c8;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  string local_378;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  cmValue local_308;
  string local_300;
  cmAlphaNum local_2e0;
  cmAlphaNum local_2b0;
  undefined1 local_280 [8];
  string message;
  string local_258;
  cmValue local_238;
  cmValue genName;
  string local_228;
  undefined1 local_208 [16];
  string local_1f8;
  undefined1 local_1d8 [8];
  string fullName;
  string local_1b0;
  cmValue local_190;
  cmValue extraGenName;
  string local_180;
  cmValue local_160;
  cmValue genName_1;
  string local_150;
  undefined4 local_12c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  Status local_108;
  Status local_100;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  undefined1 local_98 [8];
  string redirectsDir;
  string local_70;
  int local_50;
  Status SStack_4c;
  int res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cmake *local_18;
  cmake *this_local;
  
  local_18 = this;
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  std::operator+(&local_38,psVar3,"/CMakeFiles/CMakeScratch");
  SStack_4c = cmsys::SystemTools::RemoveADirectory(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_50 = DoPreConfigureChecks(this);
  if (local_50 < 0) {
    return -2;
  }
  if (local_50 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"CMAKE_HOME_DIRECTORY",
               (allocator<char> *)(redirectsDir.field_2._M_local_buf + 0xf));
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    AddCacheEntry(this,&local_70,psVar3,
                  "Source directory with the top level CMakeLists.txt file for this project",4);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)(redirectsDir.field_2._M_local_buf + 0xf));
  }
  psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
  cmAlphaNum::cmAlphaNum(&local_c8,psVar3);
  cmAlphaNum::cmAlphaNum(&local_f8,"/CMakeFiles/pkgRedirects");
  cmStrCat<>((string *)local_98,&local_c8,&local_f8);
  local_100 = cmsys::SystemTools::RemoveADirectory((string *)local_98);
  local_108 = cmsys::SystemTools::MakeDirectory((string *)local_98,(mode_t *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_108);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"CMAKE_FIND_PACKAGE_REDIRECTS_DIR",
               (allocator<char> *)((long)&genName_1.Value + 7));
    AddCacheEntry(this,&local_150,(string *)local_98,"Value Computed by CMake.",5);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)((long)&genName_1.Value + 7));
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
    if (!bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"CMAKE_GENERATOR",
                 (allocator<char> *)((long)&extraGenName.Value + 7));
      local_160 = cmState::GetInitializedCacheValue(pcVar4,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName.Value + 7));
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"CMAKE_EXTRA_GENERATOR",
                 (allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      local_190 = cmState::GetInitializedCacheValue(pcVar4,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      bVar1 = cmValue::operator_cast_to_bool(&local_160);
      if (bVar1) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_160);
        bVar1 = cmValue::operator_cast_to_bool(&local_190);
        local_208[0xe] = 0;
        if (bVar1) {
          psVar5 = cmValue::operator*[abi_cxx11_(&local_190);
          std::__cxx11::string::string((string *)&local_1f8,(string *)psVar5);
        }
        else {
          std::allocator<char>::allocator();
          local_208[0xe] = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,"",(allocator<char> *)(local_208 + 0xf));
        }
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_1d8,psVar3,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        if ((local_208[0xe] & 1) != 0) {
          std::allocator<char>::~allocator((allocator<char> *)(local_208 + 0xf));
        }
        CreateGlobalGenerator((cmake *)local_208,(string *)this,SUB81(local_1d8,0));
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator=
                  (&this->GlobalGenerator,
                   (unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   local_208);
        std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::~unique_ptr
                  ((unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_> *)
                   local_208);
        std::__cxx11::string::~string((string *)local_1d8);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
      if (bVar1) {
        pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        bVar1 = cmGlobalGenerator::GetForceUnixPaths(pcVar7);
        cmSystemTools::SetForceUnixPaths(bVar1);
      }
      else {
        CreateDefaultGlobalGenerator(this);
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->GlobalGenerator);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"Could not create generator",
                   (allocator<char> *)((long)&genName.Value + 7));
        cmSystemTools::Error(&local_228);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator((allocator<char> *)((long)&genName.Value + 7));
        this_local._4_4_ = -1;
        local_12c = 1;
        goto LAB_0052183c;
      }
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_258,"CMAKE_GENERATOR",
               (allocator<char> *)(message.field_2._M_local_buf + 0xf));
    local_238 = cmState::GetInitializedCacheValue(pcVar4,&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_238);
    if (bVar1) {
      pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_238);
      uVar2 = (*pcVar7->_vptr_cmGlobalGenerator[4])(pcVar7,psVar3);
      if ((uVar2 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_2b0,"Error: generator : ");
        pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
                 operator->(&this->GlobalGenerator);
        (*pcVar7->_vptr_cmGlobalGenerator[3])(&local_300);
        cmAlphaNum::cmAlphaNum(&local_2e0,&local_300);
        psVar3 = cmValue::operator*[abi_cxx11_(&local_238);
        cmStrCat<char[48],std::__cxx11::string,char[104]>
                  ((string *)local_280,&local_2b0,&local_2e0,
                   (char (*) [48])"\nDoes not match the generator used previously: ",psVar3,
                   (char (*) [104])
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        std::__cxx11::string::~string((string *)&local_300);
        cmSystemTools::Error((string *)local_280);
        this_local._4_4_ = -2;
        local_12c = 1;
        std::__cxx11::string::~string((string *)local_280);
        goto LAB_0052183c;
      }
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_328,"CMAKE_GENERATOR",&local_329);
    local_308 = cmState::GetInitializedCacheValue(pcVar4,&local_328);
    bVar1 = cmValue::operator_cast_to_bool(&local_308);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator(&local_329);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_350,"CMAKE_GENERATOR",&local_351);
      pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      (*pcVar7->_vptr_cmGlobalGenerator[3])(&local_378);
      AddCacheEntry(this,&local_350,&local_378,"Name of generator.",4);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&local_350);
      std::allocator<char>::~allocator(&local_351);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_398,"CMAKE_EXTRA_GENERATOR",&local_399);
      pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_3c0,pcVar7);
      AddCacheEntry(this,&local_398,&local_3c0,"Name of external makefile project generator.",4);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3e8,"CMAKE_TOOLCHAIN_FILE",
                 (allocator<char> *)(envToolchain.field_2._M_local_buf + 0xf));
      local_3c8 = cmState::GetInitializedCacheValue(pcVar4,&local_3e8);
      bVar1 = cmValue::operator_cast_to_bool(&local_3c8);
      std::__cxx11::string::~string((string *)&local_3e8);
      std::allocator<char>::~allocator((allocator<char> *)(envToolchain.field_2._M_local_buf + 0xf))
      ;
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::string((string *)local_410);
        bVar1 = cmsys::SystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE",(string *)local_410);
        if ((bVar1) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_430,"CMAKE_TOOLCHAIN_FILE",
                     (allocator<char> *)((long)&instance.Value + 7));
          AddCacheEntry(this,&local_430,(string *)local_410,"The CMake toolchain file",2);
          std::__cxx11::string::~string((string *)&local_430);
          std::allocator<char>::~allocator((allocator<char> *)((long)&instance.Value + 7));
        }
        std::__cxx11::string::~string((string *)local_410);
      }
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"CMAKE_GENERATOR_INSTANCE",
               (allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    local_440 = cmState::GetInitializedCacheValue(pcVar4,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_440);
    if (bVar1) {
      if ((this->GeneratorInstanceSet & 1U) != 0) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_440);
        bVar1 = std::operator!=(&this->GeneratorInstance,psVar3);
        if (bVar1) {
          cmAlphaNum::cmAlphaNum(&local_4b8,"Error: generator instance: ");
          cmAlphaNum::cmAlphaNum(&local_4e8,&this->GeneratorInstance);
          psVar3 = cmValue::operator*[abi_cxx11_(&local_440);
          cmStrCat<char[47],std::__cxx11::string,char[104]>
                    ((string *)local_488,&local_4b8,&local_4e8,
                     (char (*) [47])"\nDoes not match the instance used previously: ",psVar3,
                     (char (*) [104])
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_488);
          this_local._4_4_ = -2;
          local_12c = 1;
          std::__cxx11::string::~string((string *)local_488);
          goto LAB_0052183c;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_508,"CMAKE_GENERATOR_INSTANCE",
                 (allocator<char> *)((long)&platformName.Value + 7));
      AddCacheEntry(this,&local_508,&this->GeneratorInstance,"Generator instance identifier.",4);
      std::__cxx11::string::~string((string *)&local_508);
      std::allocator<char>::~allocator((allocator<char> *)((long)&platformName.Value + 7));
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_538,"CMAKE_GENERATOR_PLATFORM",
               (allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
    local_518 = cmState::GetInitializedCacheValue(pcVar4,&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator((allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_518);
    if (bVar1) {
      if ((this->GeneratorPlatformSet & 1U) != 0) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_518);
        bVar1 = std::operator!=(&this->GeneratorPlatform,psVar3);
        if (bVar1) {
          cmAlphaNum::cmAlphaNum(&local_590,"Error: generator platform: ");
          cmAlphaNum::cmAlphaNum(&local_5c0,&this->GeneratorPlatform);
          psVar3 = cmValue::operator*[abi_cxx11_(&local_518);
          cmStrCat<char[47],std::__cxx11::string,char[104]>
                    ((string *)local_560,&local_590,&local_5c0,
                     (char (*) [47])"\nDoes not match the platform used previously: ",psVar3,
                     (char (*) [104])
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_560);
          this_local._4_4_ = -2;
          local_12c = 1;
          std::__cxx11::string::~string((string *)local_560);
          goto LAB_0052183c;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5e0,"CMAKE_GENERATOR_PLATFORM",
                 (allocator<char> *)((long)&tsName.Value + 7));
      AddCacheEntry(this,&local_5e0,&this->GeneratorPlatform,"Name of generator platform.",4);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tsName.Value + 7));
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_610,"CMAKE_GENERATOR_TOOLSET",
               (allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
    local_5f0 = cmState::GetInitializedCacheValue(pcVar4,&local_610);
    std::__cxx11::string::~string((string *)&local_610);
    std::allocator<char>::~allocator((allocator<char> *)(message_3.field_2._M_local_buf + 0xf));
    bVar1 = cmValue::operator_cast_to_bool(&local_5f0);
    if (bVar1) {
      if ((this->GeneratorToolsetSet & 1U) != 0) {
        psVar3 = cmValue::operator*[abi_cxx11_(&local_5f0);
        bVar1 = std::operator!=(&this->GeneratorToolset,psVar3);
        if (bVar1) {
          cmAlphaNum::cmAlphaNum(&local_668,"Error: generator toolset: ");
          cmAlphaNum::cmAlphaNum(&local_698,&this->GeneratorToolset);
          psVar3 = cmValue::operator*[abi_cxx11_(&local_5f0);
          cmStrCat<char[46],std::__cxx11::string,char[104]>
                    ((string *)local_638,&local_668,&local_698,
                     (char (*) [46])"\nDoes not match the toolset used previously: ",psVar3,
                     (char (*) [104])
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          cmSystemTools::Error((string *)local_638);
          this_local._4_4_ = -2;
          local_12c = 1;
          std::__cxx11::string::~string((string *)local_638);
          goto LAB_0052183c;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6b8,"CMAKE_GENERATOR_TOOLSET",&local_6b9);
      AddCacheEntry(this,&local_6b8,&this->GeneratorToolset,"Name of generator toolset.",4);
      std::__cxx11::string::~string((string *)&local_6b8);
      std::allocator<char>::~allocator(&local_6b9);
    }
    bVar1 = GetIsInTryCompile(this);
    if (!bVar1) {
      pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::
               operator->(&this->GlobalGenerator);
      cmGlobalGenerator::ClearEnabledLanguages(pcVar7);
      TruncateOutputLog(this,"CMakeOutput.log");
      TruncateOutputLog(this,"CMakeError.log");
    }
    local_6d0 = this;
    std::make_unique<cmFileAPI,cmake*>((cmake **)&local_6c8);
    std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator=
              (&this->FileAPI,&local_6c8);
    std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::~unique_ptr(&local_6c8);
    this_00 = std::unique_ptr<cmFileAPI,_std::default_delete<cmFileAPI>_>::operator->
                        (&this->FileAPI);
    cmFileAPI::ReadQueries(this_00);
    pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                       (&this->GlobalGenerator);
    (*pcVar7->_vptr_cmGlobalGenerator[0xc])();
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6f8,"CMAKE_BACKWARDS_COMPATIBILITY",&local_6f9);
    local_6d8 = cmState::GetInitializedCacheValue(pcVar4,&local_6f8);
    bVar1 = cmValue::operator_cast_to_bool(&local_6d8);
    std::__cxx11::string::~string((string *)&local_6f8);
    std::allocator<char>::~allocator(&local_6f9);
    if (bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_728,"LIBRARY_OUTPUT_PATH",&local_729);
      local_708 = cmState::GetInitializedCacheValue(pcVar4,&local_728);
      bVar1 = cmValue::operator_cast_to_bool(&local_708);
      std::__cxx11::string::~string((string *)&local_728);
      std::allocator<char>::~allocator(&local_729);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_750,"LIBRARY_OUTPUT_PATH",&local_751);
        AddCacheEntry(this,&local_750,"","Single output directory for building all libraries.",1);
        std::__cxx11::string::~string((string *)&local_750);
        std::allocator<char>::~allocator(&local_751);
      }
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_780,"EXECUTABLE_OUTPUT_PATH",&local_781);
      local_760 = cmState::GetInitializedCacheValue(pcVar4,&local_780);
      bVar1 = cmValue::operator_cast_to_bool(&local_760);
      std::__cxx11::string::~string((string *)&local_780);
      std::allocator<char>::~allocator(&local_781);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_7a8,"EXECUTABLE_OUTPUT_PATH",(allocator<char> *)((long)&mf + 7))
        ;
        AddCacheEntry(this,&local_7a8,"","Single output directory for building all executables.",1);
        std::__cxx11::string::~string((string *)&local_7a8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
      }
    }
    pcVar7 = std::unique_ptr<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>::operator->
                       (&this->GlobalGenerator);
    this_01 = cmGlobalGenerator::GetMakefiles(pcVar7);
    local_7b8 = std::
                vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                ::operator[](this_01,0);
    this_02 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->(local_7b8);
    std::allocator<char>::allocator();
    local_80a = 0;
    local_80b = 0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7d8,"CTEST_USE_LAUNCHERS",&local_7d9);
    bVar1 = cmMakefile::IsOn(this_02,&local_7d8);
    local_a8a = 0;
    if (bVar1) {
      pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
      std::allocator<char>::allocator();
      local_80a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,"RULE_LAUNCH_COMPILE",&local_809);
      local_80b = 1;
      local_7e8 = cmState::GetGlobalProperty(pcVar4,&local_808);
      bVar1 = cmValue::operator_cast_to_bool(&local_7e8);
      local_a8a = bVar1 ^ 0xff;
    }
    if ((local_80b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_808);
    }
    if ((local_80a & 1) != 0) {
      std::allocator<char>::~allocator(&local_809);
    }
    std::__cxx11::string::~string((string *)&local_7d8);
    std::allocator<char>::~allocator(&local_7d9);
    if ((local_a8a & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_830,
                 "CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                 ,&local_831);
      cmSystemTools::Error(&local_830);
      std::__cxx11::string::~string((string *)&local_830);
      std::allocator<char>::~allocator(&local_831);
    }
    pcVar4 = std::unique_ptr<cmState,_std::default_delete<cmState>_>::operator->(&this->State);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    messenger = std::unique_ptr<cmMessenger,_std::default_delete<cmMessenger>_>::get
                          (&this->Messenger);
    cmState::SaveVerificationScript(pcVar4,psVar3,messenger);
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    SaveCache(this,psVar3);
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (bVar1) {
      this_local._4_4_ = -1;
      local_12c = 1;
    }
    else {
      this_local._4_4_ = 0;
      local_12c = 1;
    }
  }
  else {
    std::operator+(&local_128,"Unable to (re)create the private pkgRedirects directory:\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    cmSystemTools::Error(&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    this_local._4_4_ = -1;
    local_12c = 1;
  }
LAB_0052183c:
  std::__cxx11::string::~string((string *)local_98);
  return this_local._4_4_;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  cmSystemTools::RemoveADirectory(this->GetHomeOutputDirectory() +
                                  "/CMakeFiles/CMakeScratch");

  int res = this->DoPreConfigureChecks();
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // We want to create the package redirects directory as early as possible,
  // but not before pre-configure checks have passed. This ensures we get
  // errors about inappropriate source/binary directories first.
  const auto redirectsDir =
    cmStrCat(this->GetHomeOutputDirectory(), "/CMakeFiles/pkgRedirects");
  cmSystemTools::RemoveADirectory(redirectsDir);
  if (!cmSystemTools::MakeDirectory(redirectsDir)) {
    cmSystemTools::Error(
      "Unable to (re)create the private pkgRedirects directory:\n" +
      redirectsDir);
    return -1;
  }
  this->AddCacheEntry("CMAKE_FIND_PACKAGE_REDIRECTS_DIR", redirectsDir,
                      "Value Computed by CMake.", cmStateEnums::STATIC);

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    cmValue extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          *genName, extraGenName ? *extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  cmValue genName = this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(*genName)) {
      std::string message =
        cmStrCat("Error: generator : ", this->GlobalGenerator->GetName(),
                 "\nDoes not match the generator used previously: ", *genName,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR", this->GlobalGenerator->GetName(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry(
      "CMAKE_EXTRA_GENERATOR", this->GlobalGenerator->GetExtraGeneratorName(),
      "Name of external makefile project generator.", cmStateEnums::INTERNAL);

    if (!this->State->GetInitializedCacheValue("CMAKE_TOOLCHAIN_FILE")) {
      std::string envToolchain;
      if (cmSystemTools::GetEnv("CMAKE_TOOLCHAIN_FILE", envToolchain) &&
          !envToolchain.empty()) {
        this->AddCacheEntry("CMAKE_TOOLCHAIN_FILE", envToolchain,
                            "The CMake toolchain file",
                            cmStateEnums::FILEPATH);
      }
    }
  }

  if (cmValue instance =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_INSTANCE")) {
    if (this->GeneratorInstanceSet && this->GeneratorInstance != *instance) {
      std::string message =
        cmStrCat("Error: generator instance: ", this->GeneratorInstance,
                 "\nDoes not match the instance used previously: ", *instance,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_INSTANCE", this->GeneratorInstance,
                        "Generator instance identifier.",
                        cmStateEnums::INTERNAL);
  }

  if (cmValue platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatformSet &&
        this->GeneratorPlatform != *platformName) {
      std::string message = cmStrCat(
        "Error: generator platform: ", this->GeneratorPlatform,
        "\nDoes not match the platform used previously: ", *platformName,
        "\nEither remove the CMakeCache.txt file and CMakeFiles "
        "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM", this->GeneratorPlatform,
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (cmValue tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolsetSet && this->GeneratorToolset != *tsName) {
      std::string message =
        cmStrCat("Error: generator toolset: ", this->GeneratorToolset,
                 "\nDoes not match the toolset used previously: ", *tsName,
                 "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.");
      cmSystemTools::Error(message);
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET", this->GeneratorToolset,
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

#if !defined(CMAKE_BOOTSTRAP)
  this->FileAPI = cm::make_unique<cmFileAPI>(this);
  this->FileAPI->ReadQueries();
#endif

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  const auto& mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  this->State->SaveVerificationScript(this->GetHomeOutputDirectory(),
                                      this->Messenger.get());
  this->SaveCache(this->GetHomeOutputDirectory());
  if (cmSystemTools::GetErrorOccurredFlag()) {
    return -1;
  }
  return 0;
}